

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::null_scoped_padder>::format
          (short_filename_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_2,memory_buf_t *dest)

{
  bool bVar1;
  char *__s;
  memory_buf_t *dest_00;
  string_view_t view;
  size_t local_60;
  basic_string_view<char> local_50;
  null_scoped_padder local_39;
  size_t sStack_38;
  null_scoped_padder p;
  size_t text_size;
  char *filename;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  short_filename_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  bVar1 = source_loc::empty(&msg->source);
  if (!bVar1) {
    __s = basename((msg->source).filename);
    bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
    if (bVar1) {
      local_60 = CLI::std::char_traits<char>::length(__s);
    }
    else {
      local_60 = 0;
    }
    sStack_38 = local_60;
    dest_00 = dest;
    null_scoped_padder::null_scoped_padder
              (&local_39,local_60,&(this->super_flag_formatter).padinfo_,dest);
    ::fmt::v7::basic_string_view<char>::basic_string_view(&local_50,__s);
    view.size_ = (size_t)dest;
    view.data_ = (char *)local_50.size_;
    fmt_helper::append_string_view((fmt_helper *)local_50.data_,view,dest_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }